

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

void install_long_range_feedback(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  Am_Constraint *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Object AVar6;
  ushort uVar7;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Create((char *)&AStack_38);
  uVar7 = (ushort)&AStack_38;
  uVar2 = Am_Object::Set(uVar7,100,0);
  uVar2 = Am_Object::Set(uVar2,0x65,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)long_feed_width);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar3);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)long_feed_height);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar3);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  Am_Object::operator=(&SP_Long_Feed,pAVar5);
  Am_Object::~Am_Object(&AStack_38);
  Am_Object::Am_Object(&local_18,&SP_Long_Feed);
  Am_Object::Add_Part((Am_Object)0x10e3e8,SUB81(&local_18,0),1);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Create((char *)&AStack_38);
  uVar2 = Am_Object::Set(uVar7,(char *)0xb9,0x10a280);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xba,_Am_Inter_In);
  pAVar5 = (Am_Object *)
           Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xd2,(ulong)keep_inside_window.from_wrapper);
  Am_Object::operator=(&SP_Long_Inter,pAVar5);
  Am_Object::~Am_Object(&AStack_38);
  AVar1 = LONG_INTER;
  Am_Object::Am_Object(&local_20,&SP_Long_Inter);
  AVar6.data._2_6_ = 0;
  AVar6.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xe428,AVar6,(ulong)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Get_Object(uVar7,0x10e490);
  Am_Object::Set(uVar7,(Am_Method_Wrapper *)0xca,(ulong)do_scroll_short_agg.from_wrapper);
  Am_Object::~Am_Object(&AStack_38);
  Am_Object::Create((char *)&AStack_38);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&SP_Ship);
  uVar2 = Am_Object::Add(uVar7,(Am_Wrapper *)0xa3,(ulong)pAVar4);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)long_range_ship_left);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,(ulong)pAVar3);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)long_range_ship_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar3);
  uVar2 = Am_Object::Set(uVar2,0x66,5);
  uVar2 = Am_Object::Set(uVar2,0x67,5);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)long_range_ship_fill);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x6a,(ulong)pAVar3);
  Am_Object::operator=(&SP_Long_Range_Ship,pAVar5);
  Am_Object::~Am_Object(&AStack_38);
  Am_Object::Create((char *)&AStack_38);
  uVar2 = Am_Object::Set(uVar7,100,0);
  uVar2 = Am_Object::Set(uVar2,0x65,0);
  uVar2 = Am_Object::Set(uVar2,0x9e,(ulong)(uint)SP_Margin);
  uVar2 = Am_Object::Set(uVar2,0x9f,(ulong)(uint)SP_Margin);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Fill_To_Right);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar3);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Fill_To_Bottom);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar3);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)long_map_items);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0xa2,(ulong)pAVar3);
  Am_Object::Am_Object(&local_30,&SP_Long_Range_Ship);
  pAVar5 = (Am_Object *)Am_Object::Set_Part(uVar2,(Am_Object)0xa5,(ulong)&local_30);
  Am_Object::operator=(&SP_Long_Map,pAVar5);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&AStack_38);
  Am_Object::Am_Object(&local_28,&SP_Long_Map);
  Am_Object::Add_Part((Am_Object)0x10e3e8,SUB81(&local_28,0),1);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
install_long_range_feedback()
{
  SP_Long_Feed = Am_Rectangle.Create("SP_Long_Feed")
                     .Set(Am_LEFT, 0)
                     .Set(Am_TOP, 0)
                     .Set(Am_WIDTH, (long_feed_width))
                     .Set(Am_HEIGHT, (long_feed_height))
                     .Set(Am_LINE_STYLE, Am_White);
  SP_Long_Win.Add_Part(SP_Long_Feed);

  SP_Long_Inter = Am_Move_Grow_Interactor.Create("SP_Long_Inter")
                      .Set(Am_START_WHEN, "LEFT_DOWN")
                      .Set(Am_START_WHERE_TEST, Am_Inter_In)
                      .Set(Am_GRID_METHOD, keep_inside_window);
  SP_Long_Feed.Add_Part(LONG_INTER, SP_Long_Inter);
  SP_Long_Inter.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, do_scroll_short_agg);

  SP_Long_Range_Ship = Am_Arc.Create("SP_Long_Range_Ship")
                           .Add(Am_ITEM, SP_Ship) // Set by SP_Long_Map
                           .Set(Am_LEFT, (long_range_ship_left))
                           .Set(Am_TOP, (long_range_ship_top))
                           .Set(Am_WIDTH, 5)
                           .Set(Am_HEIGHT, 5)
                           .Set(Am_LINE_STYLE, Am_No_Style)
                           .Set(Am_FILL_STYLE, (long_range_ship_fill));

  SP_Long_Map = Am_Map.Create("SP_Long_Map")
                    .Set(Am_LEFT, 0)
                    .Set(Am_TOP, 0)
                    .Set(Am_LEFT_OFFSET, SP_Margin)
                    .Set(Am_TOP_OFFSET, SP_Margin)
                    .Set(Am_WIDTH, Am_Fill_To_Right)
                    .Set(Am_HEIGHT, Am_Fill_To_Bottom)
                    //    .Set (Am_WIDTH, (long_win_width))
                    //    .Set (Am_HEIGHT, (long_win_height))
                    .Set(Am_ITEMS, (long_map_items))
                    .Set_Part(Am_ITEM_PROTOTYPE, SP_Long_Range_Ship);

  SP_Long_Win.Add_Part(SP_Long_Map);
}